

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

void * deMemPool_allocInternal(deMemPool *pool,size_t numBytes,deUint32 alignBytes)

{
  int iVar1;
  int a;
  void *ptr;
  int newPageCapacity;
  int maxAlignPadding;
  size_t alignPadding;
  void *alignedPtr;
  void *curPagePtr;
  MemPage *curPage;
  deUint32 alignBytes_local;
  size_t numBytes_local;
  deMemPool *pool_local;
  
  curPagePtr = pool->currentPage;
  ptr = (void *)((long)&((MemPage *)((long)curPagePtr + 0x10))->capacity +
                (long)((MemPage *)curPagePtr)->bytesAllocated);
  alignPadding = (size_t)deAlignPtr(ptr,(ulong)alignBytes);
  _newPageCapacity = alignPadding - (long)ptr;
  if ((ulong)(long)(((MemPage *)curPagePtr)->capacity - ((MemPage *)curPagePtr)->bytesAllocated) <
      numBytes + _newPageCapacity) {
    iVar1 = deMax32(0,alignBytes - 4);
    a = deMin32(((MemPage *)curPagePtr)->capacity << 1,0x1fa0);
    iVar1 = deMax32(a,(int)numBytes + iVar1);
    curPagePtr = MemPage_create((long)iVar1);
    if ((MemPage *)curPagePtr == (MemPage *)0x0) {
      return (void *)0x0;
    }
    ((MemPage *)curPagePtr)->nextPage = pool->currentPage;
    pool->currentPage = (MemPage *)curPagePtr;
    alignPadding = (size_t)deAlignPtr((MemPage *)((long)curPagePtr + 0x10),(ulong)alignBytes);
    _newPageCapacity = alignPadding - ((long)curPagePtr + 0x10);
  }
  *(int *)((long)curPagePtr + 4) =
       (int)numBytes + (int)_newPageCapacity + *(int *)((long)curPagePtr + 4);
  return (void *)alignPadding;
}

Assistant:

DE_INLINE void* deMemPool_allocInternal (deMemPool* pool, size_t numBytes, deUint32 alignBytes)
{
	MemPage* curPage = pool->currentPage;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (pool->allowFailing)
	{
		if ((deRandom_getUint32(&pool->failRandom) & 16383) <= 15)
			return DE_NULL;
	}
#endif

#if defined(DE_SUPPORT_DEBUG_POOLS)
	if (pool->enableDebugAllocs)
	{
		DebugAlloc*	header	= DE_NEW(DebugAlloc);
		void*		ptr		= deAlignedMalloc(numBytes, alignBytes);

		if (!header || !ptr)
		{
			deFree(header);
			deAlignedFree(ptr);
			return DE_NULL;
		}

		header->memPtr	= ptr;
		header->next	= pool->debugAllocListHead;
		pool->debugAllocListHead = header;

		return ptr;
	}
#endif

	DE_ASSERT(curPage);
	DE_ASSERT(deIsPowerOfTwo32((int)alignBytes));
	{
		void*	curPagePtr		= (void*)((deUint8*)(curPage + 1) + curPage->bytesAllocated);
		void*	alignedPtr		= deAlignPtr(curPagePtr, alignBytes);
		size_t	alignPadding	= (size_t)((deUintptr)alignedPtr - (deUintptr)curPagePtr);

		if (numBytes + alignPadding > (size_t)(curPage->capacity - curPage->bytesAllocated))
		{
			/* Does not fit to current page. */
			int		maxAlignPadding		= deMax32(0, ((int)alignBytes)-MEM_PAGE_BASE_ALIGN);
			int		newPageCapacity		= deMax32(deMin32(2*curPage->capacity, MAX_PAGE_SIZE), ((int)numBytes)+maxAlignPadding);

			curPage = MemPage_create((size_t)newPageCapacity);
			if (!curPage)
				return DE_NULL;

			curPage->nextPage	= pool->currentPage;
			pool->currentPage	= curPage;

			DE_ASSERT(curPage->bytesAllocated == 0);

			curPagePtr			= (void*)(curPage + 1);
			alignedPtr			= deAlignPtr(curPagePtr, alignBytes);
			alignPadding		= (size_t)((deUintptr)alignedPtr - (deUintptr)curPagePtr);

			DE_ASSERT(numBytes + alignPadding <= (size_t)curPage->capacity);
		}

		curPage->bytesAllocated += (int)(numBytes + alignPadding);
		return alignedPtr;
	}
}